

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateNonbasicValue
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *objChange)

{
  byte bVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_48;
  
  bVar1 = this->m_nonbasicValueUpToDate;
  if ((bool)bVar1 == true) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              (&(this->m_nonbasicValue).m_backend,&objChange->m_backend);
    bVar1 = this->m_nonbasicValueUpToDate;
  }
  if ((bVar1 & 1) == 0) {
    local_48.m_backend.fpclass = cpp_dec_float_finite;
    local_48.m_backend.prec_elem = 10;
    local_48.m_backend.data._M_elems[0] = 0;
    local_48.m_backend.data._M_elems[1] = 0;
    local_48.m_backend.data._M_elems[2] = 0;
    local_48.m_backend.data._M_elems[3] = 0;
    local_48.m_backend.data._M_elems[4] = 0;
    local_48.m_backend.data._M_elems[5] = 0;
    local_48.m_backend.data._M_elems._24_5_ = 0;
    local_48.m_backend.data._M_elems[7]._1_3_ = 0;
    local_48.m_backend.data._M_elems._32_5_ = 0;
    local_48.m_backend._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_48,-1e+100);
  }
  else {
    nonbasicValue(&local_48,this);
  }
  return this->m_nonbasicValueUpToDate;
}

Assistant:

bool SPxSolverBase<R>::updateNonbasicValue(R objChange)
   {
      if(m_nonbasicValueUpToDate)
         m_nonbasicValue += objChange;

      SPxOut::debug(this, "Iteration: {} updated objValue: {} new value: {} correct value: {}\n",
                    this->iteration(), objChange, m_nonbasicValue, m_nonbasicValueUpToDate ? nonbasicValue() : -1e100);

      return m_nonbasicValueUpToDate;
   }